

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

void __thiscall
QTextStreamPrivate::putString(QTextStreamPrivate *this,QLatin1StringView data,bool number)

{
  FieldAlignment FVar1;
  char16_t cVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  size_t __n;
  ulong len;
  long lVar4;
  ulong len_00;
  byte *__buf;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_70;
  QString local_58;
  char16_t local_3a;
  long local_38;
  
  __n = CONCAT71(in_register_00000009,number);
  __buf = (byte *)data.m_data;
  lVar5 = data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (long)(this->params).fieldWidth;
  len_00 = lVar4 - lVar5;
  if (len_00 == 0 || lVar4 < lVar5) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      write(this,(int)data.m_size,__buf,__n);
      return;
    }
    goto LAB_002faa8b;
  }
  FVar1 = (this->params).fieldAlignment;
  len = (ulong)FVar1;
  switch(len) {
  case 0:
    break;
  case 1:
  case 3:
    goto switchD_002fa915_caseD_1;
  case 2:
    len = (long)len_00 / 2;
    len_00 = len_00 - len;
    break;
  default:
    len_00 = 0;
switchD_002fa915_caseD_1:
    len = len_00;
    __n = CONCAT71(in_register_00000009,!number || FVar1 != AlignAccountingStyle);
    if (number && FVar1 == AlignAccountingStyle) {
      if (lVar5 < 1) {
        uVar3 = 0;
      }
      else {
        uVar3 = (uint)*__buf;
      }
      cVar2 = (char16_t)uVar3;
      local_3a = cVar2;
      QLocale::negativeSign(&local_58,&this->locale);
      if (local_58.d.size == 1) {
        bVar6 = true;
        __n = (size_t)uVar3;
        if (*local_58.d.ptr != cVar2) goto LAB_002fa986;
      }
      else {
LAB_002fa986:
        QLocale::positiveSign(&local_70,&this->locale);
        if (local_70.d.size == 1) {
          __n = (size_t)uVar3;
          bVar6 = *local_70.d.ptr == cVar2;
        }
        else {
          bVar6 = false;
        }
        if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (bVar6) {
        write(this,(int)&local_3a,(void *)0x1,__n);
        __buf = __buf + 1;
        lVar5 = lVar5 + -1;
      }
    }
    len_00 = 0;
  }
  writePadding(this,len);
  write(this,(int)lVar5,__buf,__n);
  writePadding(this,len_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002faa8b:
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::putString(QLatin1StringView data, bool number)
{
    if (Q_UNLIKELY(params.fieldWidth > data.size())) {

        // handle padding

        const PaddingResult pad = padding(data.size());

        if (params.fieldAlignment == QTextStream::AlignAccountingStyle && number) {
            const QChar sign = data.size() > 0 ? QLatin1Char(*data.data()) : QChar();
            if (sign == locale.negativeSign() || sign == locale.positiveSign()) {
                // write the sign before the padding, then skip it later
                write(&sign, 1);
                data = QLatin1StringView(data.data() + 1, data.size() - 1);
            }
        }

        writePadding(pad.left);
        write(data);
        writePadding(pad.right);
    } else {
        write(data);
    }
}